

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_lower.c
# Opt level: O0

AstNode * call_iterator_function
                    (CompilerState *compiler_state,LuaSymbol *fsym,LuaSymbol *ssym,LuaSymbol *varsym
                    ,int nvars)

{
  AstNode *pAVar1;
  AstNode *pAVar2;
  AstNode *pAVar3;
  AstNode *call_expr;
  AstNode *suffixed_expr;
  int nvars_local;
  LuaSymbol *varsym_local;
  LuaSymbol *ssym_local;
  LuaSymbol *fsym_local;
  CompilerState *compiler_state_local;
  
  pAVar1 = allocate_expr_ast_node(compiler_state,EXPR_SUFFIXED);
  pAVar2 = make_symbol_expr(compiler_state,fsym);
  (pAVar1->field_2).function_stmt.function_expr = pAVar2;
  set_type((VariableType *)&(pAVar1->field_2).return_stmt,RAVI_TANY);
  (pAVar1->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  pAVar2 = allocate_expr_ast_node(compiler_state,EXPR_FUNCTION_CALL);
  (pAVar2->field_2).function_stmt.function_expr = (AstNode *)0x0;
  (pAVar2->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
  (pAVar2->field_2).function_call_expr.num_results = nvars;
  set_type((VariableType *)&(pAVar2->field_2).return_stmt,RAVI_TANY);
  pAVar3 = make_symbol_expr(compiler_state,ssym);
  add_ast_node(compiler_state,&(pAVar2->field_2).for_stmt.for_statement_list,pAVar3);
  pAVar3 = make_symbol_expr(compiler_state,varsym);
  add_ast_node(compiler_state,&(pAVar2->field_2).for_stmt.for_statement_list,pAVar3);
  add_ast_node(compiler_state,&(pAVar1->field_2).for_stmt.for_statement_list,pAVar2);
  return pAVar1;
}

Assistant:

static AstNode *call_iterator_function(CompilerState *compiler_state, LuaSymbol *fsym, LuaSymbol *ssym, LuaSymbol *varsym, int nvars)
{
	AstNode *suffixed_expr = allocate_expr_ast_node(compiler_state, EXPR_SUFFIXED);
	suffixed_expr->suffixed_expr.primary_expr = make_symbol_expr(compiler_state, fsym);
	set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
	suffixed_expr->suffixed_expr.suffix_list = NULL;

	AstNode *call_expr = allocate_expr_ast_node(compiler_state, EXPR_FUNCTION_CALL);
	call_expr->function_call_expr.method_name = NULL;
	call_expr->function_call_expr.arg_list = NULL;
	call_expr->function_call_expr.num_results = nvars; /* We want same number of results as there are variables */
	set_type(&call_expr->function_call_expr.type, RAVI_TANY);

	add_ast_node(compiler_state, &call_expr->function_call_expr.arg_list, make_symbol_expr(compiler_state, ssym));
	add_ast_node(compiler_state, &call_expr->function_call_expr.arg_list, make_symbol_expr(compiler_state, varsym));

	add_ast_node(compiler_state, &suffixed_expr->suffixed_expr.suffix_list, call_expr);

	return suffixed_expr;
}